

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_decompress_usingDTable
                 (void *dst,size_t originalSize,void *cSrc,size_t cSrcSize,FSE_DTable *dt)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  FSE_DTable FVar7;
  FSE_DTable FVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  undefined1 *puVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  
  puVar13 = (undefined1 *)((long)dst + (originalSize - 3));
  if (*(short *)((long)dt + 2) != 0) {
    if (cSrcSize == 0) {
      return 0xffffffffffffffb8;
    }
    if (cSrcSize < 8) {
      uVar14 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar14 = uVar14 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar14 = uVar14 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar14 = uVar14 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      }
      bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar2 == 0) {
        return 0xffffffffffffffec;
      }
      uVar16 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      iVar15 = (uVar16 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
      lVar10 = 0;
    }
    else {
      bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar2 == 0) {
        return 0xffffffffffffffff;
      }
      if (0xffffffffffffff88 < cSrcSize) {
        return cSrcSize;
      }
      uVar14 = *(ulong *)((long)cSrc + (cSrcSize - 8));
      lVar10 = cSrcSize - 8;
      uVar16 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      iVar15 = ~uVar16 + 9;
    }
    uVar6 = (ushort)*dt;
    if (0x1f < uVar6) goto LAB_0010db28;
    uVar16 = iVar15 + (uint)uVar6;
    uVar21 = uVar14 >> (-(char)uVar16 & 0x3fU);
    if (uVar16 < 0x41) {
      if (lVar10 < 8) {
        if (lVar10 == 0) {
          lVar10 = 0;
          goto LAB_0010d339;
        }
        uVar9 = (uint)lVar10;
        if (cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)(uVar16 >> 3)))) {
          uVar9 = uVar16 >> 3;
        }
        uVar16 = uVar16 + uVar9 * -8;
      }
      else {
        uVar9 = uVar16 >> 3;
        uVar16 = uVar16 & 7;
      }
      lVar10 = lVar10 - (ulong)uVar9;
      uVar14 = *(ulong *)((long)cSrc + lVar10);
    }
LAB_0010d339:
    uVar16 = uVar16 + uVar6;
    uVar17 = (ulong)((uint)uVar21 & BIT_mask[(uint)uVar6]);
    uVar21 = (ulong)(BIT_mask[(uint)uVar6] & (uint)(uVar14 >> (-(char)uVar16 & 0x3fU)));
    if (uVar16 < 0x41) {
      if (lVar10 < 8) {
        if (lVar10 == 0) {
          lVar10 = 0;
          goto LAB_0010d390;
        }
        uVar9 = (uint)lVar10;
        if (cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)(uVar16 >> 3)))) {
          uVar9 = uVar16 >> 3;
        }
        uVar16 = uVar16 + uVar9 * -8;
      }
      else {
        uVar9 = uVar16 >> 3;
        uVar16 = uVar16 & 7;
      }
      lVar10 = lVar10 - (ulong)uVar9;
      uVar14 = *(ulong *)((long)cSrc + lVar10);
    }
LAB_0010d390:
    puVar19 = (undefined1 *)dst;
    if (uVar16 < 0x41) {
      do {
        if (lVar10 < 8) {
          if (lVar10 == 0) {
            lVar10 = 0;
            break;
          }
          uVar9 = uVar16 >> 3;
          bVar23 = cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)uVar9));
          if (!bVar23) {
            uVar9 = (uint)lVar10;
          }
          uVar16 = uVar16 + uVar9 * -8;
        }
        else {
          uVar9 = uVar16 >> 3;
          uVar16 = uVar16 & 7;
          bVar23 = true;
        }
        lVar10 = lVar10 - (ulong)uVar9;
        uVar14 = *(ulong *)((long)cSrc + lVar10);
        if ((puVar13 <= puVar19) || (!bVar23)) break;
        bVar2 = *(byte *)((long)dt + uVar17 * 4 + 7);
        if (bVar2 == 0) goto LAB_0010db09;
        uVar22 = (ulong)(ushort)dt[uVar17 + 1];
        *puVar19 = *(undefined1 *)((long)dt + uVar17 * 4 + 6);
        bVar3 = *(byte *)((long)dt + uVar21 * 4 + 7);
        if (bVar3 == 0) goto LAB_0010db09;
        uVar17 = (uVar14 << ((byte)uVar16 & 0x3f)) >> (-bVar2 & 0x3f);
        uVar11 = (ulong)(ushort)dt[uVar21 + 1];
        puVar19[1] = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
        lVar18 = uVar17 * 4;
        bVar4 = *(byte *)((long)dt + uVar22 * 4 + lVar18 + 7);
        if (bVar4 == 0) goto LAB_0010db09;
        uVar21 = (uVar14 << ((byte)(uVar16 + bVar2) & 0x3f)) >> (-bVar3 & 0x3f);
        FVar7 = dt[uVar17 + uVar22 + 1];
        puVar19[2] = *(undefined1 *)((long)dt + uVar22 * 4 + lVar18 + 6);
        lVar18 = uVar21 * 4;
        bVar5 = *(byte *)((long)dt + uVar11 * 4 + lVar18 + 7);
        if (bVar5 == 0) goto LAB_0010db09;
        iVar15 = uVar16 + bVar2 + (uint)bVar3;
        uVar17 = ((uVar14 << ((byte)iVar15 & 0x3f)) >> (-bVar4 & 0x3f)) + (ulong)(ushort)FVar7;
        iVar15 = iVar15 + (uint)bVar4;
        uVar21 = ((uVar14 << ((byte)iVar15 & 0x3f)) >> (-bVar5 & 0x3f)) +
                 (ulong)(ushort)dt[uVar21 + uVar11 + 1];
        uVar16 = iVar15 + (uint)bVar5;
        puVar19[3] = *(undefined1 *)((long)dt + uVar11 * 4 + lVar18 + 6);
        puVar19 = puVar19 + 4;
        if (0x40 < uVar16) break;
      } while( true );
    }
    puVar13 = (undefined1 *)((long)dst + (originalSize - 2));
    if (puVar13 < puVar19) {
      return 0xffffffffffffffba;
    }
    lVar18 = (long)puVar19 - (long)dst;
    puVar19 = puVar19 + 1;
    do {
      uVar22 = uVar21;
      bVar2 = *(byte *)((long)dt + uVar17 * 4 + 7);
      if (bVar2 == 0) {
LAB_0010db09:
        __assert_fail("nbBits >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
      }
      FVar7 = dt[uVar17 + 1];
      uVar21 = uVar14 << ((byte)uVar16 & 0x3f);
      uVar16 = uVar16 + bVar2;
      puVar19[-1] = *(undefined1 *)((long)dt + uVar17 * 4 + 6);
      if (0x40 < uVar16) {
        lVar10 = 2;
        if (*(char *)((long)dt + uVar22 * 4 + 7) == '\0') goto LAB_0010db09;
LAB_0010d66d:
        *puVar19 = *(undefined1 *)((long)dt + uVar22 * 4 + 6);
        goto LAB_0010dae7;
      }
      if (lVar10 < 8) {
        if (lVar10 != 0) {
          uVar9 = (uint)lVar10;
          if (cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)(uVar16 >> 3)))) {
            uVar9 = uVar16 >> 3;
          }
          uVar16 = uVar16 + uVar9 * -8;
          goto LAB_0010d585;
        }
        lVar10 = 0;
      }
      else {
        uVar9 = uVar16 >> 3;
        uVar16 = uVar16 & 7;
LAB_0010d585:
        lVar10 = lVar10 - (ulong)uVar9;
        uVar14 = *(ulong *)((long)cSrc + lVar10);
      }
      if (puVar13 < puVar19) {
        return 0xffffffffffffffba;
      }
      bVar3 = *(byte *)((long)dt + uVar22 * 4 + 7);
      if (bVar3 == 0) goto LAB_0010db09;
      lVar1 = uVar22 * 4;
      FVar8 = dt[uVar22 + 1];
      uVar17 = uVar14 << ((byte)uVar16 & 0x3f);
      uVar22 = (uVar21 >> (-bVar2 & 0x3f)) + (ulong)(ushort)FVar7;
      uVar16 = uVar16 + bVar3;
      *puVar19 = *(undefined1 *)((long)dt + lVar1 + 6);
      if (0x40 < uVar16) {
        if (*(char *)((long)dt + uVar22 * 4 + 7) != '\0') {
          puVar19 = puVar19 + 1;
          lVar10 = 3;
          goto LAB_0010d66d;
        }
        goto LAB_0010db09;
      }
      if (lVar10 < 8) {
        if (lVar10 != 0) {
          uVar9 = (uint)lVar10;
          if (cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)(uVar16 >> 3)))) {
            uVar9 = uVar16 >> 3;
          }
          uVar16 = uVar16 + uVar9 * -8;
          goto LAB_0010d60e;
        }
        lVar10 = 0;
      }
      else {
        uVar9 = uVar16 >> 3;
        uVar16 = uVar16 & 7;
LAB_0010d60e:
        lVar10 = lVar10 - (ulong)uVar9;
        uVar14 = *(ulong *)((long)cSrc + lVar10);
      }
      lVar18 = lVar18 + 2;
      puVar20 = puVar19 + 1;
      puVar19 = puVar19 + 2;
      uVar21 = (uVar17 >> (-bVar3 & 0x3f)) + (ulong)(ushort)FVar8;
      uVar17 = uVar22;
      if (puVar13 < puVar20) {
        return 0xffffffffffffffba;
      }
    } while( true );
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  if (cSrcSize < 8) {
    uVar14 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 2:
      goto LAB_0010d6dc;
    case 3:
      goto LAB_0010d6d2;
    case 4:
      goto LAB_0010d6c8;
    case 5:
      goto LAB_0010d6bd;
    case 6:
      break;
    case 7:
      uVar14 = uVar14 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      break;
    default:
      goto switchD_0010d311_default;
    }
    uVar14 = uVar14 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
LAB_0010d6bd:
    uVar14 = uVar14 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
LAB_0010d6c8:
    uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
LAB_0010d6d2:
    uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
LAB_0010d6dc:
    uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
switchD_0010d311_default:
    bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar2 == 0) {
      return 0xffffffffffffffec;
    }
    uVar16 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    iVar15 = (uVar16 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    lVar10 = 0;
  }
  else {
    bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar2 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar14 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    lVar10 = cSrcSize - 8;
    uVar16 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    iVar15 = ~uVar16 + 9;
  }
  uVar6 = (ushort)*dt;
  if (0x1f < uVar6) {
LAB_0010db28:
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x65d,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
  }
  uVar16 = iVar15 + (uint)uVar6;
  uVar21 = uVar14 >> (-(char)uVar16 & 0x3fU);
  if (uVar16 < 0x41) {
    if (lVar10 < 8) {
      if (lVar10 == 0) {
        lVar10 = 0;
        goto LAB_0010d78b;
      }
      uVar9 = (uint)lVar10;
      if (cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)(uVar16 >> 3)))) {
        uVar9 = uVar16 >> 3;
      }
      uVar16 = uVar16 + uVar9 * -8;
    }
    else {
      uVar9 = uVar16 >> 3;
      uVar16 = uVar16 & 7;
    }
    lVar10 = lVar10 - (ulong)uVar9;
    uVar14 = *(ulong *)((long)cSrc + lVar10);
  }
LAB_0010d78b:
  uVar16 = uVar16 + uVar6;
  uVar17 = (ulong)((uint)uVar21 & BIT_mask[(uint)uVar6]);
  uVar21 = (ulong)(BIT_mask[(uint)uVar6] & (uint)(uVar14 >> (-(char)uVar16 & 0x3fU)));
  puVar19 = (undefined1 *)dst;
  if (uVar16 < 0x41) {
    if (lVar10 < 8) {
      if (lVar10 == 0) {
        lVar10 = 0;
        goto LAB_0010d7f1;
      }
      uVar9 = (uint)lVar10;
      if (cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)(uVar16 >> 3)))) {
        uVar9 = uVar16 >> 3;
      }
      uVar16 = uVar16 + uVar9 * -8;
    }
    else {
      uVar9 = uVar16 >> 3;
      uVar16 = uVar16 & 7;
    }
    lVar10 = lVar10 - (ulong)uVar9;
    uVar14 = *(ulong *)((long)cSrc + lVar10);
  }
LAB_0010d7f1:
  while (uVar16 < 0x41) {
    if (lVar10 < 8) {
      if (lVar10 == 0) {
        lVar10 = 0;
        break;
      }
      uVar9 = uVar16 >> 3;
      bVar23 = cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)uVar9));
      if (!bVar23) {
        uVar9 = (uint)lVar10;
      }
      uVar16 = uVar16 + uVar9 * -8;
    }
    else {
      uVar9 = uVar16 >> 3;
      uVar16 = uVar16 & 7;
      bVar23 = true;
    }
    lVar10 = lVar10 - (ulong)uVar9;
    uVar14 = *(ulong *)((long)cSrc + lVar10);
    if ((puVar13 <= puVar19) || (!bVar23)) break;
    bVar2 = *(byte *)((long)dt + uVar17 * 4 + 7);
    if (0x1f < (ulong)bVar2) goto LAB_0010db28;
    uVar22 = (ulong)(ushort)dt[uVar17 + 1];
    uVar9 = BIT_mask[bVar2];
    *puVar19 = *(undefined1 *)((long)dt + uVar17 * 4 + 6);
    bVar3 = *(byte *)((long)dt + uVar21 * 4 + 7);
    if (0x1f < (ulong)bVar3) goto LAB_0010db28;
    uVar17 = (ulong)(uVar9 & (uint)(uVar14 >> (-(char)(uVar16 + bVar2) & 0x3fU)));
    uVar11 = (ulong)(ushort)dt[uVar21 + 1];
    uVar9 = BIT_mask[bVar3];
    puVar19[1] = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
    lVar18 = uVar17 * 4;
    bVar4 = *(byte *)((long)dt + uVar22 * 4 + lVar18 + 7);
    if (0x1f < (ulong)bVar4) goto LAB_0010db28;
    iVar15 = uVar16 + bVar2 + (uint)bVar3;
    uVar21 = (ulong)(uVar9 & (uint)(uVar14 >> (-(char)iVar15 & 0x3fU)));
    FVar7 = dt[uVar17 + uVar22 + 1];
    uVar16 = BIT_mask[bVar4];
    puVar19[2] = *(undefined1 *)((long)dt + uVar22 * 4 + lVar18 + 6);
    lVar18 = uVar21 * 4;
    bVar2 = *(byte *)((long)dt + uVar11 * 4 + lVar18 + 7);
    if (0x1f < bVar2) goto LAB_0010db28;
    iVar15 = iVar15 + (uint)bVar4;
    uVar17 = (ulong)(uVar16 & (uint)(uVar14 >> (-(char)iVar15 & 0x3fU))) + (ulong)(ushort)FVar7;
    uVar16 = iVar15 + (uint)bVar2;
    uVar21 = (ulong)((uint)(uVar14 >> (-(char)uVar16 & 0x3fU)) & BIT_mask[bVar2]) +
             (ulong)(ushort)dt[uVar21 + uVar11 + 1];
    puVar19[3] = *(undefined1 *)((long)dt + uVar11 * 4 + lVar18 + 6);
    puVar19 = puVar19 + 4;
  }
  puVar13 = (undefined1 *)((long)dst + (originalSize - 2));
  if (puVar19 <= puVar13) {
    lVar18 = (long)puVar19 - (long)dst;
    puVar19 = puVar19 + 1;
    do {
      bVar2 = *(byte *)((long)dt + uVar17 * 4 + 7);
      if (0x1f < bVar2) goto LAB_0010db28;
      FVar7 = dt[uVar17 + 1];
      uVar16 = uVar16 + bVar2;
      uVar22 = uVar14 >> (-(char)uVar16 & 0x3fU);
      uVar9 = BIT_mask[bVar2];
      puVar19[-1] = *(undefined1 *)((long)dt + uVar17 * 4 + 6);
      if (0x40 < uVar16) {
        lVar10 = 2;
        if (*(byte *)((long)dt + uVar21 * 4 + 7) < 0x20) goto LAB_0010dade;
        goto LAB_0010db28;
      }
      if (lVar10 < 8) {
        if (lVar10 != 0) {
          uVar12 = (uint)lVar10;
          if (cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)(uVar16 >> 3)))) {
            uVar12 = uVar16 >> 3;
          }
          uVar16 = uVar16 + uVar12 * -8;
          goto LAB_0010d9f3;
        }
        lVar10 = 0;
      }
      else {
        uVar12 = uVar16 >> 3;
        uVar16 = uVar16 & 7;
LAB_0010d9f3:
        lVar10 = lVar10 - (ulong)uVar12;
        uVar14 = *(ulong *)((long)cSrc + lVar10);
      }
      if (puVar13 < puVar19) {
        return 0xffffffffffffffba;
      }
      bVar2 = *(byte *)((long)dt + uVar21 * 4 + 7);
      if (0x1f < bVar2) goto LAB_0010db28;
      uVar17 = (ulong)((uint)uVar22 & uVar9) + (ulong)(ushort)FVar7;
      FVar7 = dt[uVar21 + 1];
      uVar16 = uVar16 + bVar2;
      uVar22 = uVar14 >> (-(char)uVar16 & 0x3fU);
      uVar9 = BIT_mask[bVar2];
      *puVar19 = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
      if (0x40 < uVar16) {
        if (*(byte *)((long)dt + uVar17 * 4 + 7) < 0x20) {
          puVar19 = puVar19 + 1;
          lVar10 = 3;
          uVar21 = uVar17;
LAB_0010dade:
          *puVar19 = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
LAB_0010dae7:
          return lVar10 + lVar18;
        }
        goto LAB_0010db28;
      }
      if (lVar10 < 8) {
        if (lVar10 != 0) {
          uVar12 = (uint)lVar10;
          if (cSrc <= (void *)((long)cSrc + (lVar10 - (ulong)(uVar16 >> 3)))) {
            uVar12 = uVar16 >> 3;
          }
          uVar16 = uVar16 + uVar12 * -8;
          goto LAB_0010da8a;
        }
        lVar10 = 0;
      }
      else {
        uVar12 = uVar16 >> 3;
        uVar16 = uVar16 & 7;
LAB_0010da8a:
        lVar10 = lVar10 - (ulong)uVar12;
        uVar14 = *(ulong *)((long)cSrc + lVar10);
      }
      uVar21 = (ulong)((uint)uVar22 & uVar9) + (ulong)(ushort)FVar7;
      lVar18 = lVar18 + 2;
      puVar20 = puVar19 + 1;
      puVar19 = puVar19 + 2;
    } while (puVar20 <= puVar13);
  }
  return 0xffffffffffffffba;
}

Assistant:

size_t FSE_decompress_usingDTable(void* dst, size_t originalSize,
                            const void* cSrc, size_t cSrcSize,
                            const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* DTableH = (const FSE_DTableHeader*)ptr;
    const U32 fastMode = DTableH->fastMode;

    /* select fast mode (static) */
    if (fastMode) return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 1);
    return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 0);
}